

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest> * __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::getResumingRequest
          (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest> *__return_storage_ptr__,
          HttpInputStreamImpl *this,OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method,
          StringPtr url)

{
  Tag TVar1;
  ConnectRequest local_78;
  HttpConnectMethod *local_68;
  HttpConnectMethod *_kj_switch_done_1;
  HttpConnectMethod *m_1;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *local_50;
  char *local_48;
  HttpMethod *local_40;
  HttpMethod *_kj_switch_done;
  HttpMethod *m;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *_kj_switch_subject;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *method_local;
  StringPtr url_local;
  
  url_local.content.ptr = url.content.ptr;
  _kj_switch_subject = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)this;
  method_local = method;
  url_local.content.size_ = (size_t)__return_storage_ptr__;
  m = &OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::_switchSubject
                 ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)this)->tag;
  TVar1 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::which
                    ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
  if (TVar1 == _variant0) {
    local_40 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpMethod>
                         ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
    if (local_40 != (HttpMethod *)0x0) {
      m_1._0_4_ = *local_40;
      local_50 = method_local;
      local_48 = url_local.content.ptr;
      _kj_switch_done = local_40;
      OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest>::
      OneOf<kj::HttpHeaders::Request,int>
                ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest> *)
                 __return_storage_ptr__,(Request *)&m_1);
      return __return_storage_ptr__;
    }
    local_40 = (HttpMethod *)0x0;
    _kj_switch_done = (HttpMethod *)0x0;
  }
  else if (TVar1 == _variant1) {
    local_68 = OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::get<kj::HttpConnectMethod>
                         ((OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)m);
    if (local_68 != (HttpConnectMethod *)0x0) {
      local_78.authority.content.ptr = (char *)method_local;
      local_78.authority.content.size_ = (size_t)url_local.content.ptr;
      _kj_switch_done_1 = local_68;
      OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest>::
      OneOf<kj::HttpHeaders::ConnectRequest,int>
                ((OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest> *)
                 __return_storage_ptr__,&local_78);
      return __return_storage_ptr__;
    }
    local_68 = (HttpConnectMethod *)0x0;
    _kj_switch_done_1 = (HttpConnectMethod *)0x0;
  }
  kj::_::unreachable();
}

Assistant:

static kj::OneOf<HttpHeaders::Request, HttpHeaders::ConnectRequest> getResumingRequest(
      kj::OneOf<HttpMethod, HttpConnectMethod> method,
      kj::StringPtr url) {
    KJ_SWITCH_ONEOF(method) {
      KJ_CASE_ONEOF(m, HttpMethod) {
        return HttpHeaders::Request { m, url };
      }
      KJ_CASE_ONEOF(m, HttpConnectMethod) {
        return HttpHeaders::ConnectRequest { url };
      }
    }
    KJ_UNREACHABLE;
  }